

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_sock_write_buffer(int fd,fio_packet_s *packet)

{
  uintptr_t *puVar1;
  short *psVar2;
  long lVar3;
  long *ptr;
  fio_data_s *pfVar4;
  uint uVar5;
  long lVar6;
  
  lVar6 = (long)fd * 0xa8;
  uVar5 = (**(code **)(*(long *)((long)fio_data + lVar6 + 0xa8) + 8))
                    ((long)CONCAT41(fd,*(undefined1 *)((long)fio_data + lVar6 + 0x6d)),
                     *(undefined8 *)((long)fio_data + lVar6 + 0xb0),
                     (long)(packet->data).buffer + packet->offset,packet->length);
  if (0 < (int)uVar5) {
    packet->offset = packet->offset + (ulong)(uVar5 & 0x7fffffff);
    puVar1 = &packet->length;
    *puVar1 = *puVar1 - (ulong)(uVar5 & 0x7fffffff);
    pfVar4 = fio_data;
    if (*puVar1 == 0) {
      ptr = *(long **)((long)fio_data + lVar6 + 0x40);
      *(long *)((long)fio_data + lVar6 + 0x40) = *ptr;
      LOCK();
      psVar2 = (short *)((long)pfVar4 + lVar6 + 0x68);
      *psVar2 = *psVar2 + -1;
      pfVar4 = fio_data;
      UNLOCK();
      lVar3 = (long)fio_data + lVar6 + 0x40;
      if (*ptr == 0) {
        *(long *)(lVar3 + 8) = lVar3;
        *(undefined2 *)((long)pfVar4 + lVar6 + 0x68) = 0;
      }
      else if (ptr == *(long **)(lVar3 + 8)) {
        *(long *)(lVar3 + 8) = lVar3;
      }
      (*(code *)ptr[2])(ptr[3]);
      fio_free(ptr);
    }
  }
  return uVar5;
}

Assistant:

static int fio_sock_write_buffer(int fd, fio_packet_s *packet) {
  int written = fd_data(fd).rw_hooks->write(
      fd2uuid(fd), fd_data(fd).rw_udata,
      ((uint8_t *)packet->data.buffer + packet->offset), packet->length);
  if (written > 0) {
    packet->length -= written;
    packet->offset += written;
    if (!packet->length) {
      fio_sock_packet_rotate_unsafe(fd);
    }
  }
  return written;
}